

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.h
# Opt level: O0

void __thiscall trun::TestResponseProxy::~TestResponseProxy(TestResponseProxy *this)

{
  TestResponseProxy *this_local;
  
  this->_vptr_TestResponseProxy = (_func_int **)&PTR__TestResponseProxy_003c7300;
  std::__cxx11::string::~string((string *)&this->moduleName);
  std::__cxx11::string::~string((string *)&this->symbolName);
  std::__cxx11::string::~string((string *)&this->exceptionString);
  trun::AssertError::~AssertError(&this->assertError);
  return;
}

Assistant:

virtual ~TestResponseProxy() = default;